

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

void start_pass_coef(j_compress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_c_coef_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  code *pcVar3;
  
  pjVar1 = cinfo->coef;
  *(undefined4 *)&pjVar1[1].start_pass = 0;
  start_iMCU_row(cinfo);
  if (pass_mode == JBUF_SAVE_AND_PASS) {
    if (pjVar1[7].start_pass == (_func_void_j_compress_ptr_J_BUF_MODE *)0x0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pcVar3 = compress_first_pass;
  }
  else if (pass_mode == JBUF_CRANK_DEST) {
    if (pjVar1[7].start_pass == (_func_void_j_compress_ptr_J_BUF_MODE *)0x0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pcVar3 = compress_output;
  }
  else {
    if (pass_mode != JBUF_PASS_THRU) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      return;
    }
    if (pjVar1[7].start_pass != (_func_void_j_compress_ptr_J_BUF_MODE *)0x0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 3;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pcVar3 = compress_data;
  }
  pjVar1->compress_data = pcVar3;
  return;
}

Assistant:

METHODDEF(void)
start_pass_coef (j_compress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  coef->iMCU_row_num = 0;
  start_iMCU_row(cinfo);

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (coef->whole_image[0] != NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    coef->pub.compress_data = compress_data;
    break;
#ifdef FULL_COEF_BUFFER_SUPPORTED
  case JBUF_SAVE_AND_PASS:
    if (coef->whole_image[0] == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    coef->pub.compress_data = compress_first_pass;
    break;
  case JBUF_CRANK_DEST:
    if (coef->whole_image[0] == NULL)
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    coef->pub.compress_data = compress_output;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
}